

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

wchar_t borg_new_kill(uint r_idx,wchar_t y,wchar_t x)

{
  ushort uVar1;
  borg_grid *pbVar2;
  chunk_conflict *c;
  monster_race *pmVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  loc_conflict grid;
  monster *pmVar8;
  borg_kill *pbVar9;
  char *pcVar10;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t x0;
  wchar_t y0;
  monster_conflict *m_ptr;
  monster_race *r_ptr;
  borg_grid *ag;
  borg_kill *kill;
  wchar_t n;
  wchar_t i;
  wchar_t x_local;
  wchar_t y_local;
  uint r_idx_local;
  
  kill._0_4_ = L'\xffffffff';
  for (kill._4_4_ = L'\x01'; (wchar_t)kill < L'\0' && kill._4_4_ < borg_kills_nxt;
      kill._4_4_ = kill._4_4_ + L'\x01') {
    if (borg_kills[kill._4_4_].r_idx == 0) {
      kill._0_4_ = kill._4_4_;
    }
  }
  if (((wchar_t)kill < L'\0') && (borg_kills_nxt < 0xff)) {
    kill._0_4_ = (wchar_t)borg_kills_nxt;
    borg_kills_nxt = borg_kills_nxt + 1;
  }
  if ((wchar_t)kill < L'\0') {
    borg_note("# Too many monsters");
    uVar5 = Rand_div((int)borg_kills_nxt - 1);
    kill._0_4_ = uVar5 + L'\x02';
    borg_delete_kill((wchar_t)kill);
  }
  c = cave;
  grid = (loc_conflict)loc(x,y);
  pmVar8 = square_monster((chunk *)c,grid);
  pmVar3 = r_info;
  if (pmVar8 == (monster *)0x0) {
    y_local = L'\xffffffff';
  }
  else {
    borg_kills_cnt = borg_kills_cnt + 1;
    pbVar9 = borg_kills + (wchar_t)kill;
    uVar1 = pbVar9->r_idx;
    pbVar2 = borg_grids[y];
    pbVar9->r_idx = (uint16_t)r_idx;
    (pbVar9->pos).x = x;
    pbVar9->ox = (uint8_t)x;
    (pbVar9->pos).y = y;
    pbVar9->oy = (uint8_t)y;
    pbVar9->m_idx = (int16_t)pmVar8->midx;
    borg_grids[(pbVar9->pos).y][(pbVar9->pos).x].kill = (uint8_t)(wchar_t)kill;
    pbVar9->when = borg_t;
    if (pbVar9->r_idx == borg_morgoth_id) {
      borg_t_morgoth = borg_t;
    }
    borg_update_kill_new((wchar_t)kill);
    borg_update_kill_old((wchar_t)kill);
    pcVar10 = borg_race_name((uint)pbVar9->r_idx);
    pcVar10 = format("# Creating a monster \'%s\' at (%d,%d), HP: %d, Time: %d, Index: %d",pcVar10,
                     (ulong)(uint)(pbVar9->pos).y,(ulong)(uint)(pbVar9->pos).x,
                     (ulong)(uint)(int)pbVar9->power,(ulong)(uint)(int)pbVar9->when,
                     (uint)pbVar9->r_idx);
    borg_note(pcVar10);
    borg_danger_wipe = true;
    if ((int)borg_t < borg.need_see_invis + 5) {
      iVar6 = borg.c.y / 0xb;
      iVar7 = borg.c.x / 0xb;
      if (iVar6 < 1) {
        local_74 = 0;
      }
      else {
        local_74 = iVar6 + -1;
      }
      if (iVar7 < 1) {
        local_78 = 0;
      }
      else {
        local_78 = iVar7 + -1;
      }
      if (iVar7 < 5) {
        local_7c = iVar7 + 1;
      }
      else {
        local_7c = 5;
      }
      if (iVar7 < 0x11) {
        local_80 = iVar7 + 1;
      }
      else {
        local_80 = 0x11;
      }
      borg_fear_region[iVar6][iVar7] = 0;
      borg_fear_region[iVar6][local_78] = 0;
      borg_fear_region[iVar6][local_80] = 0;
      borg_fear_region[local_74][iVar7] = 0;
      borg_fear_region[local_7c][iVar7] = 0;
      borg_fear_region[local_74][local_78] = 0;
      borg_fear_region[local_74][local_80] = 0;
      borg_fear_region[local_7c][local_78] = 0;
      borg_fear_region[local_7c][local_80] = 0;
      pcVar10 = borg_race_name((uint)pbVar9->r_idx);
      pcVar10 = format("# Removing Regional Fear (%d,%d) because of a LOS %s",(ulong)(uint)y,
                       (ulong)(uint)x,pcVar10);
      borg_note(pcVar10);
    }
    if ((borg.trait[0x1a] != 0) &&
       (_Var4 = borg_los((pbVar9->pos).y,(pbVar9->pos).x,borg.c.y,borg.c.x), _Var4)) {
      borg.goal.type = 0;
    }
    _Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (!_Var4) {
      pbVar2[x].feat = '\x01';
    }
    _Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (_Var4) {
      pbVar2[x].feat = '\x15';
    }
    for (kill._4_4_ = 0; kill._4_4_ < (int)(uint)borg_nasties_num; kill._4_4_ = kill._4_4_ + 1) {
      if (r_info[pbVar9->r_idx].d_char == (int)borg_nasties[kill._4_4_]) {
        borg_nasties_count[kill._4_4_] = borg_nasties_count[kill._4_4_] + '\x01';
      }
    }
    y_local = (wchar_t)kill;
  }
  return y_local;
}

Assistant:

static int borg_new_kill(unsigned int r_idx, int y, int x)
{
    int i, n = -1;

    borg_kill           *kill;
    borg_grid           *ag;
    struct monster_race *r_ptr;
    struct monster      *m_ptr;

    /* Look for a "dead" monster */
    for (i = 1; (n < 0) && (i < borg_kills_nxt); i++) {
        /* Skip real entries */
        if (!borg_kills[i].r_idx)
            n = i;
    }

    /* Allocate a new monster */
    if ((n < 0) && (borg_kills_nxt < 255)) {
        /* Acquire the entry, advance */
        n = borg_kills_nxt++;
    }

    /* Hack -- steal an old monster */
    if (n < 0) {
        /* Note */
        borg_note("# Too many monsters");

        /* Hack -- Pick a random monster */
        n = randint1(borg_kills_nxt - 1) + 1;

        /* Kill it */
        borg_delete_kill(n);
    }

    /* it might be that it can't be found */
    m_ptr = square_monster(cave, loc(x, y));
    if (!m_ptr)
        return -1;

    /* Count the monsters */
    borg_kills_cnt++;

    /* Access the monster */
    kill  = &borg_kills[n];
    r_ptr = &r_info[kill->r_idx];
    ag    = &borg_grids[y][x];

    /* Save the race */
    kill->r_idx = r_idx;

    /* Location */
    kill->ox = kill->pos.x = x;
    kill->oy = kill->pos.y = y;

    /* Games Index of the monster */
    kill->m_idx = m_ptr->midx;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = n;

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Update the monster */
    borg_update_kill_new(n);

    /* Update the monster */
    borg_update_kill_old(n);

    /* Note (r_info[kill->r_idx].name)*/
    borg_note(format(
        "# Creating a monster '%s' at (%d,%d), HP: %d, Time: %d, Index: %d",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, kill->power,
        kill->when, kill->r_idx));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Remove Regional Fear which may have been induced from a non-LOS monster.
     * We assume this newly created monster is the one which induced our
     * Regional Fear.  If it wasn't, then the borg will create new Regional Fear
     * next time the unseen monster attacks.  There is no harm done by clearing
     * these. At most, he may end up resting in an area for 1 turn */
    if (borg_t < borg.need_see_invis + 5) {
        int y0, x0, y1, x1, y2, x2;

        y0 = (borg.c.y / 11);
        x0 = (borg.c.x / 11);

        /* Nearby regions */
        y1 = (y0 > 0) ? (y0 - 1) : 0;
        x1 = (x0 > 0) ? (x0 - 1) : 0;
        y2 = (x0 < 5) ? (x0 + 1) : 5;
        x2 = (x0 < 17) ? (x0 + 1) : 17;

        /* Remove "fear", spread around */
        borg_fear_region[y0][x0] = 0;
        borg_fear_region[y0][x1] = 0;
        borg_fear_region[y0][x2] = 0;
        borg_fear_region[y1][x0] = 0;
        borg_fear_region[y2][x0] = 0;
        borg_fear_region[y1][x1] = 0;
        borg_fear_region[y1][x2] = 0;
        borg_fear_region[y2][x1] = 0;
        borg_fear_region[y2][x2] = 0;
        borg_note(format("# Removing Regional Fear (%d,%d) because of a LOS %s",
            y, x, borg_race_name(kill->r_idx)));
    }

    /* Wipe goals only if I have some light source */
    if (borg.trait[BI_LIGHT]
        && borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x))
        borg.goal.type = 0;

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!(rf_has(r_ptr->flags, RF_PASS_WALL))) {
        ag->feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        ag->feat = FEAT_GRANITE;
    }

    /* Count up out list of Nasties */
    for (i = 0; i < borg_nasties_num; i++) {
        /* Count them up */
        if (r_info[kill->r_idx].d_char == borg_nasties[i])
            borg_nasties_count[i]++;
    }

    /* Return the monster */
    return n;
}